

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::AddState
          (TransitionObservationIndependentMADPDiscrete *this,Index agentI,string *name)

{
  size_type sVar1;
  EInvalidIndex *this_00;
  uint in_ESI;
  long in_RDI;
  string *in_stack_ffffffffffffffb8;
  MultiAgentDecisionProcessDiscrete *in_stack_ffffffffffffffc0;
  
  sVar1 = std::
          vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
          ::size((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                  *)(in_RDI + 0xd8));
  if (sVar1 <= in_ESI) {
    this_00 = (EInvalidIndex *)__cxa_allocate_exception(0x28);
    EInvalidIndex::EInvalidIndex(this_00,(char *)in_stack_ffffffffffffffb8);
    __cxa_throw(this_00,&EInvalidIndex::typeinfo,EInvalidIndex::~EInvalidIndex);
  }
  std::
  vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
  ::operator[]((vector<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
                *)(in_RDI + 0xd8),(ulong)in_ESI);
  MultiAgentDecisionProcessDiscrete::AddState(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void TransitionObservationIndependentMADPDiscrete::AddState(Index agentI, const string &name)
{
    if(agentI >= _m_individualMADPDs.size())
        throw EInvalidIndex("TransitionObservationIndependentMADPDiscrete::AddState - agentI out of bounds...");
    _m_individualMADPDs[agentI]->AddState(name);    
}